

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ConvertToHalfPass::ProcessConvert(ConvertToHalfPass *this,Instruction *inst)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  DefUseManager *pDVar4;
  Instruction *pIVar5;
  Instruction *val_inst;
  uint32_t val_id;
  uint32_t local_1c;
  Instruction *local_18;
  Instruction *inst_local;
  ConvertToHalfPass *this_local;
  
  local_18 = inst;
  inst_local = (Instruction *)this;
  bVar1 = IsFloat(this,inst,0x20);
  if (bVar1) {
    uVar2 = opt::Instruction::result_id(local_18);
    bVar1 = IsRelaxed(this,uVar2);
    pIVar5 = local_18;
    if (bVar1) {
      uVar2 = opt::Instruction::type_id(local_18);
      uVar2 = EquivFloatTypeId(this,uVar2,0x10);
      opt::Instruction::SetResultType(pIVar5,uVar2);
      pDVar4 = Pass::get_def_use_mgr(&this->super_Pass);
      analysis::DefUseManager::AnalyzeInstUse(pDVar4,local_18);
      local_1c = opt::Instruction::result_id(local_18);
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)&this->converted_ids_,&local_1c);
    }
  }
  uVar2 = opt::Instruction::GetSingleWordInOperand(local_18,0);
  pDVar4 = Pass::get_def_use_mgr(&this->super_Pass);
  pIVar5 = analysis::DefUseManager::GetDef(pDVar4,uVar2);
  uVar2 = opt::Instruction::type_id(local_18);
  uVar3 = opt::Instruction::type_id(pIVar5);
  if (uVar2 == uVar3) {
    opt::Instruction::SetOpcode(local_18,OpCopyObject);
  }
  return true;
}

Assistant:

bool ConvertToHalfPass::ProcessConvert(Instruction* inst) {
  // If float32 and relaxed, change to float16 convert
  if (IsFloat(inst, 32) && IsRelaxed(inst->result_id())) {
    inst->SetResultType(EquivFloatTypeId(inst->type_id(), 16));
    get_def_use_mgr()->AnalyzeInstUse(inst);
    converted_ids_.insert(inst->result_id());
  }
  // If operand and result types are the same, change FConvert to CopyObject to
  // keep validator happy; simplification and DCE will clean it up
  // One way this can happen is if an FConvert generated during this pass
  // (likely by ProcessPhi) is later encountered here and its operand has been
  // changed to half.
  uint32_t val_id = inst->GetSingleWordInOperand(0);
  Instruction* val_inst = get_def_use_mgr()->GetDef(val_id);
  if (inst->type_id() == val_inst->type_id())
    inst->SetOpcode(spv::Op::OpCopyObject);
  return true;  // modified
}